

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_18de7e::StateBasic::Run(StateBasic *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Test *pTVar2;
  int iVar3;
  Rule *this_00;
  _Rb_tree_header *p_Var4;
  Edge *edge;
  Node *pNVar5;
  StringPiece text;
  StringPiece text_00;
  StringPiece text_01;
  StringPiece text_02;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  StringPiece path_03;
  StringPiece path_04;
  EvalString command;
  State state;
  string local_168;
  EvalString local_148;
  State local_128;
  
  State::State(&local_128);
  local_148.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  text.len_ = 4;
  text.str_ = "cat ";
  EvalString::AddText(&local_148,text);
  text_00.len_ = 2;
  text_00.str_ = "in";
  EvalString::AddSpecial(&local_148,text_00);
  text_01.len_ = 3;
  text_01.str_ = " > ";
  EvalString::AddText(&local_148,text_01);
  text_02.len_ = 3;
  text_02.str_ = "out";
  EvalString::AddSpecial(&local_148,text_02);
  this_00 = (Rule *)operator_new(0x50);
  paVar1 = &local_168.field_2;
  local_168._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"cat","");
  (this_00->name_)._M_dataplus._M_p = (pointer)&(this_00->name_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this_00,local_168._M_dataplus._M_p,
             local_168._M_dataplus._M_p + local_168._M_string_length);
  p_Var4 = &(this_00->bindings_)._M_t._M_impl.super__Rb_tree_header;
  (this_00->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this_00->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
  (this_00->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
  (this_00->bindings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar1) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  local_168._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"command","");
  Rule::AddBinding(this_00,&local_168,&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar1) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  BindingEnv::AddRule(&local_128.bindings_,this_00);
  edge = State::AddEdge(&local_128,this_00);
  path_02.len_ = 3;
  path_02.str_ = "in1";
  State::AddIn(&local_128,edge,path_02,0);
  path_03.len_ = 3;
  path_03.str_ = "in2";
  State::AddIn(&local_128,edge,path_03,0);
  path_04.len_ = 3;
  path_04.str_ = "out";
  State::AddOut(&local_128,edge,path_04,0);
  pTVar2 = g_current_test;
  Edge::EvaluateCommand_abi_cxx11_(&local_168,edge,false);
  iVar3 = std::__cxx11::string::compare((char *)&local_168);
  testing::Test::Check
            (pTVar2,iVar3 == 0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/state_test.cc"
             ,0x29,"\"cat in1 in2 > out\" == edge->EvaluateCommand()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar1) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  pTVar2 = g_current_test;
  path.len_ = 3;
  path.str_ = "in1";
  pNVar5 = State::GetNode(&local_128,path,0);
  testing::Test::Check
            (pTVar2,(bool)(pNVar5->dirty_ ^ 1),
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/state_test.cc"
             ,0x2b,"state.GetNode(\"in1\", 0)->dirty()");
  pTVar2 = g_current_test;
  path_00.len_ = 3;
  path_00.str_ = "in2";
  pNVar5 = State::GetNode(&local_128,path_00,0);
  testing::Test::Check
            (pTVar2,(bool)(pNVar5->dirty_ ^ 1),
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/state_test.cc"
             ,0x2c,"state.GetNode(\"in2\", 0)->dirty()");
  pTVar2 = g_current_test;
  path_01.len_ = 3;
  path_01.str_ = "out";
  pNVar5 = State::GetNode(&local_128,path_01,0);
  testing::Test::Check
            (pTVar2,(bool)(pNVar5->dirty_ ^ 1),
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/state_test.cc"
             ,0x2d,"state.GetNode(\"out\", 0)->dirty()");
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector(&local_148.parsed_);
  if (local_128.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_128.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001d8ce8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_128.bindings_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_128.bindings_.bindings_._M_t);
  if (local_128.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&local_128.pools_._M_t);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_128);
  return;
}

Assistant:

TEST(State, Basic) {
  State state;

  EvalString command;
  command.AddText("cat ");
  command.AddSpecial("in");
  command.AddText(" > ");
  command.AddSpecial("out");

  Rule* rule = new Rule("cat");
  rule->AddBinding("command", command);
  state.bindings_.AddRule(rule);

  Edge* edge = state.AddEdge(rule);
  state.AddIn(edge, "in1", 0);
  state.AddIn(edge, "in2", 0);
  state.AddOut(edge, "out", 0);

  EXPECT_EQ("cat in1 in2 > out", edge->EvaluateCommand());

  EXPECT_FALSE(state.GetNode("in1", 0)->dirty());
  EXPECT_FALSE(state.GetNode("in2", 0)->dirty());
  EXPECT_FALSE(state.GetNode("out", 0)->dirty());
}